

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void __thiscall soul::StructuralParser::parseFunctionOrStateVariable(StructuralParser *this)

{
  SourceCodeText *pSVar1;
  NoopStatement *pNVar2;
  Scope *pSVar3;
  ModuleBase *pMVar4;
  bool isExternal;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Function *pFVar7;
  char *location;
  pool_ptr<soul::AST::Expression> type;
  Context declarationContext;
  Context context;
  undefined1 local_1b8 [16];
  UTF8Reader local_1a8;
  Ptr local_1a0;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  local_198;
  _Alloc_hider local_178;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  local_170;
  Context local_158;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  local_140;
  Context local_128;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  local_1b8._8_8_ = (this->super_SOULTokeniser).location.sourceCode.object;
  if ((SourceCodeText *)local_1b8._8_8_ != (SourceCodeText *)0x0) {
    (((SourceCodeText *)local_1b8._8_8_)->super_RefCountedObject).refCount =
         (((SourceCodeText *)local_1b8._8_8_)->super_RefCountedObject).refCount + 1;
  }
  local_1a8.data = (this->super_SOULTokeniser).location.location.data;
  local_1a0.object = (SourceCodeText *)this->currentScope;
  isExternal = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
               ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27b5f4);
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,"static_assert");
  if (bVar5) {
    parseStaticAssert(this);
  }
  else {
    tryParsingType((StructuralParser *)local_1b8,(ParseTypeContext)this);
    if ((Expression *)local_1b8._0_8_ == (Expression *)0x0) {
      CompileMessageHelpers::createMessage<>
                (&local_68,syntax,error,"Expected a function or variable declaration");
      AST::Context::throwError((Context *)(local_1b8 + 8),&local_68,false);
    }
    pSVar1 = (this->super_SOULTokeniser).location.sourceCode.object;
    if (pSVar1 != (SourceCodeText *)0x0) {
      (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
    }
    pNVar2 = (NoopStatement *)(this->super_SOULTokeniser).location.location.data;
    pSVar3 = this->currentScope;
    local_158.location.sourceCode.object = pSVar1;
    local_158.location.location.data = (char *)pNVar2;
    local_158.parentScope = pSVar3;
    local_178._M_p = (pointer)parseIdentifier(this);
    local_198.
    super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259fc0);
    if (bVar5) {
      parseGenericFunctionWildcardList(&local_140,this);
      local_198.
      super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_140.
           super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_198.
      super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_140.
           super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_198.
      super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_140.
           super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pFVar7 = (Function *)
               local_140.
               super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      pFVar7 = (Function *)0x0;
    }
    bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27f6d5);
    if (bVar5) {
      if (isExternal) {
        CompileMessageHelpers::createMessage<>
                  (&local_a0,syntax,error,"A function declaration cannot be marked \'external\'");
        AST::Context::throwError((Context *)(local_1b8 + 8),&local_a0,false);
      }
      pMVar4 = (this->module).object;
      if (pMVar4 == (ModuleBase *)0x0) {
LAB_001dcc2d:
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      iVar6 = (*(pMVar4->super_ASTObject)._vptr_ASTObject[0xc])();
      if ((vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
           *)CONCAT44(extraout_var,iVar6) ==
          (vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
           *)0x0) {
        pMVar4 = (this->module).object;
        if (pMVar4 != (ModuleBase *)0x0) {
          iVar6 = (*(pMVar4->super_ASTObject)._vptr_ASTObject[5])();
          if ((char)iVar6 == '\0') {
            CompileMessageHelpers::createMessage<>
                      (&local_110,syntax,error,"Cannot declare a function in this scope");
          }
          else {
            CompileMessageHelpers::createMessage<>
                      (&local_110,syntax,error,
                       "Functions can only be declared inside a processor or namespace");
          }
          AST::Context::throwError((Context *)(local_1b8 + 8),&local_110,false);
        }
        goto LAB_001dcc2d;
      }
      if ((Expression *)local_1b8._0_8_ == (Expression *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      std::
      vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ::vector(&local_170,&local_198);
      local_140.
      super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)parseFunctionDeclaration
                              (this,(Context *)(local_1b8 + 8),(Expression *)local_1b8._0_8_,
                               (Identifier)local_178._M_p,&local_158,&local_170);
      std::
      vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
      ::emplace_back<soul::pool_ref<soul::AST::Function>>
                ((vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
                  *)CONCAT44(extraout_var,iVar6),(pool_ref<soul::AST::Function> *)&local_140);
      pFVar7 = (Function *)
               local_198.
               super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_170.
          super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170.
                        super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_170.
                              super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_170.
                              super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        pFVar7 = (Function *)
                 local_198.
                 super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    else {
      if (isExternal) {
        if ((Expression *)local_1b8._0_8_ == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        iVar6 = (*(((Statement *)local_1b8._0_8_)->super_ASTObject)._vptr_ASTObject[10])();
        if (iVar6 == 0) {
          CompileMessageHelpers::createMessage<>
                    (&local_d8,syntax,error,
                     "External declarations do not require the \'const\' keyword");
          AST::Context::throwError((Context *)(local_1b8 + 8),&local_d8,false);
        }
      }
      pMVar4 = (this->module).object;
      if (pMVar4 == (ModuleBase *)0x0) {
        iVar6 = 0x3c;
        location = "operator->";
LAB_001dcc51:
        throwInternalCompilerError("object != nullptr",location,iVar6);
      }
      iVar6 = (*(pMVar4->super_ASTObject)._vptr_ASTObject[0xb])();
      local_140.
      super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar6);
      if ((Expression *)local_1b8._0_8_ == (Expression *)0x0) {
        iVar6 = 0x3b;
        location = "operator*";
        goto LAB_001dcc51;
      }
      if (pSVar1 != (SourceCodeText *)0x0) {
        (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
      }
      local_128.location.sourceCode.object = pSVar1;
      local_128.location.location.data = (char *)pNVar2;
      local_128.parentScope = pSVar3;
      parseVariableDeclaration<soul::StructuralParser::parseFunctionOrStateVariable()::_lambda(soul::AST::VariableDeclaration&)_1_>
                (this,(Expression *)local_1b8._0_8_,(Identifier)local_178._M_p,isExternal,&local_128
                 ,(anon_class_8_1_ee5ece24 *)&local_140);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_128.location.sourceCode.object);
    }
    if (pFVar7 != (Function *)0x0) {
      operator_delete(pFVar7,(long)local_198.
                                   super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar7
                     );
    }
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_158.location.sourceCode.object);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_1b8._8_8_);
  return;
}

Assistant:

void parseFunctionOrStateVariable()
    {
        auto declarationContext = getContext();
        bool isExternal = matchIf (Keyword::external);

        if (matches ("static_assert"))
            return parseStaticAssert();

        auto type = tryParsingType (ParseTypeContext::variableType);

        if (type == nullptr)
            declarationContext.throwError (Errors::expectedFunctionOrVariable());

        auto context = getContext();
        auto name = parseIdentifier();

        std::vector<pool_ref<AST::UnqualifiedName>> genericWildcards;

        if (matchIf (Operator::lessThan))
            genericWildcards = parseGenericFunctionWildcardList();

        if (matchIf (Operator::openParen))
        {
            if (isExternal)
                declarationContext.throwError (Errors::functionCannotBeExternal());

            if (auto functions = module->getFunctionList())
                functions->push_back (parseFunctionDeclaration (declarationContext, *type, name, context, genericWildcards));
            else
                declarationContext.throwError (module->isGraph() ? Errors::graphCannotContainFunctions()
                                                                 : Errors::noFunctionInThisScope());
        }
        else
        {
            if (isExternal && type->getConstness() == AST::Constness::definitelyConst)
                declarationContext.throwError (Errors::noConstOnExternals());

            auto& stateVariables = module->getStateVariableList();

            parseVariableDeclaration (*type, name, isExternal, context,
                                      [&] (AST::VariableDeclaration& v)  { stateVariables.push_back (v); });
        }
    }